

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

bool __thiscall
llvm::
DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
::allocateBuckets(DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
                  *this,uint Num)

{
  DenseMapPair<DBKeyID,_llbuild::core::KeyID> *pDVar1;
  bool bVar2;
  uint Num_local;
  DenseMap<DBKeyID,_llbuild::core::KeyID,_llvm::DenseMapInfo<DBKeyID>,_llvm::detail::DenseMapPair<DBKeyID,_llbuild::core::KeyID>_>
  *this_local;
  
  this->NumBuckets = Num;
  bVar2 = this->NumBuckets != 0;
  if (bVar2) {
    pDVar1 = (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)
             operator_new((ulong)this->NumBuckets << 4);
    this->Buckets = pDVar1;
  }
  else {
    this->Buckets = (DenseMapPair<DBKeyID,_llbuild::core::KeyID> *)0x0;
  }
  return bVar2;
}

Assistant:

bool allocateBuckets(unsigned Num) {
    NumBuckets = Num;
    if (NumBuckets == 0) {
      Buckets = nullptr;
      return false;
    }

    Buckets = static_cast<BucketT*>(operator new(sizeof(BucketT) * NumBuckets));
    return true;
  }